

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<float>::Transpose(TPZMatrix<float> *this,TPZMatrix<float> *T)

{
  int64_t c;
  long lVar1;
  int64_t r;
  long lVar2;
  undefined1 local_2c [4];
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZBaseMatrix).fCol,(this->super_TPZBaseMatrix).fRow);
  for (lVar2 = 0; lVar2 < (this->super_TPZBaseMatrix).fRow; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 < (this->super_TPZBaseMatrix).fCol; lVar1 = lVar1 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar1);
      (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(T,lVar1,lVar2,local_2c);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}